

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

void sq_setnativedebughook(HSQUIRRELVM v,SQDEBUGHOOK hook)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  
  v->_debughook_native = hook;
  pSVar3 = (v->_debughook_closure).super_SQObject._unVal.pTable;
  SVar2 = (v->_debughook_closure).super_SQObject._type;
  (v->_debughook_closure).super_SQObject._type = OT_NULL;
  (v->_debughook_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  v->_debughook = hook != (SQDEBUGHOOK)0x0;
  return;
}

Assistant:

void sq_setnativedebughook(HSQUIRRELVM v,SQDEBUGHOOK hook)
{
    v->_debughook_native = hook;
    v->_debughook_closure.Null();
    v->_debughook = hook?true:false;
}